

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connecter.cpp
# Opt level: O3

void __thiscall
zmq::tcp_connecter_t::tcp_connecter_t
          (tcp_connecter_t *this,io_thread_t *io_thread_,session_base_t *session_,
          options_t *options_,address_t *addr_,bool delayed_start_)

{
  int iVar1;
  
  stream_connecter_base_t::stream_connecter_base_t
            (&this->super_stream_connecter_base_t,io_thread_,session_,options_,addr_,delayed_start_)
  ;
  (this->super_stream_connecter_base_t).super_own_t.super_object_t._vptr_object_t =
       (_func_int **)&PTR__tcp_connecter_t_001eb888;
  (this->super_stream_connecter_base_t).super_io_object_t.super_i_poll_events._vptr_i_poll_events =
       (_func_int **)&DAT_001eb980;
  this->_connect_timer_started = false;
  iVar1 = std::__cxx11::string::compare((char *)(this->super_stream_connecter_base_t)._addr);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_addr->protocol == protocol_name::tcp",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_connecter.cpp"
            ,0x4a);
    fflush(_stderr);
    zmq_abort("_addr->protocol == protocol_name::tcp");
  }
  return;
}

Assistant:

zmq::tcp_connecter_t::tcp_connecter_t (class io_thread_t *io_thread_,
                                       class session_base_t *session_,
                                       const options_t &options_,
                                       address_t *addr_,
                                       bool delayed_start_) :
    stream_connecter_base_t (
      io_thread_, session_, options_, addr_, delayed_start_),
    _connect_timer_started (false)
{
    zmq_assert (_addr->protocol == protocol_name::tcp);
}